

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_connection.hpp
# Opt level: O3

int __thiscall
cpp_client::Connection_internal::connect
          (Connection_internal *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo *paVar1;
  addrinfo *__ai;
  char cVar2;
  char cVar3;
  int iVar4;
  char *extraout_RAX;
  char *pcVar5;
  runtime_error *prVar6;
  uint uVar7;
  int iVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  string port_str;
  addrinfo *result;
  char *local_90;
  uint local_88;
  char local_80 [16];
  addrinfo *local_70;
  addrinfo local_68;
  
  uVar9 = (ulong)__addr & 0xffffffff;
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  cVar3 = '\x01';
  if (9 < (uint)__addr) {
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      uVar7 = (uint)uVar9;
      if (uVar7 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_0011df6a;
      }
      if (uVar7 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_0011df6a;
      }
      if (uVar7 < 10000) goto LAB_0011df6a;
      uVar9 = uVar9 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (99999 < uVar7);
    cVar3 = cVar3 + '\x01';
  }
LAB_0011df6a:
  local_90 = local_80;
  iVar8 = 0;
  std::__cxx11::string::_M_construct((ulong)&local_90,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_90,local_88,(uint)__addr);
LAB_0011df9d:
  iVar4 = getaddrinfo((char *)CONCAT44(in_register_00000034,__fd),local_90,&local_68,&local_70);
  __ai = local_70;
  switch(iVar4) {
  case 0:
    for (paVar1 = local_70; paVar1 != (addrinfo *)0x0; paVar1 = paVar1->ai_next) {
      iVar4 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      this->sock_ = iVar4;
      if ((iVar4 != -1) &&
         (iVar4 = ::connect(iVar4,paVar1->ai_addr,paVar1->ai_addrlen), iVar4 == -1)) {
        close(this->sock_);
        this->sock_ = -1;
      }
    }
    goto switchD_0011dfcc_caseD_fffffffd;
  case -10:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Could not resolve host name - Out of memory.");
    break;
  default:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Could not resolve host name - Unknown error.");
    break;
  case -4:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Could not resolve host name - Unrecoverable error.");
    break;
  case -3:
    goto switchD_0011dfcc_caseD_fffffffd;
  case -2:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"Could not resolve host name - Host not found.");
  }
  *(undefined ***)prVar6 = &PTR__runtime_error_00139408;
  __cxa_throw(prVar6,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
switchD_0011dfcc_caseD_fffffffd:
  freeaddrinfo(__ai);
  iVar8 = iVar8 + 1;
  if (iVar8 == 3) {
    if (this->sock_ == -1) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Could not connect to server.");
      *(undefined ***)prVar6 = &PTR__runtime_error_00139408;
      __cxa_throw(prVar6,&Communication_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar5 = local_80;
    if (local_90 != pcVar5) {
      operator_delete(local_90);
      pcVar5 = extraout_RAX;
    }
    return (int)pcVar5;
  }
  goto LAB_0011df9d;
}

Assistant:

void connect(const char* host, unsigned port)
   {
      struct Free_addr
      {
         addrinfo* info;
         ~Free_addr()
         {
            freeaddrinfo(info);
         }
      };
      // can have temporary name resolution failure so specify a number of tries
      constexpr auto num_tries = 3;
      // set up structures needed
      addrinfo* result;
      addrinfo hints;
      memset(&hints, 0, sizeof(hints));
      hints.ai_family = AF_UNSPEC;
      hints.ai_socktype = SOCK_STREAM;
      hints.ai_protocol = IPPROTO_IP;
      const auto port_str = std::to_string(port);
      // now try to connect
      for(auto i = 0; i < num_tries; ++i)
      {
         const auto resaddr = getaddrinfo(host, port_str.c_str(), &hints, &result);
         // free the memory allocated if going out of scope
         Free_addr dummy{result};
         if(resaddr != 0)
         {
            using ce = Communication_error;
            switch(resaddr)
            {
            case EAI_AGAIN:  continue;
            case EAI_FAIL:   throw ce("Could not resolve host name - Unrecoverable error.");
            case EAI_MEMORY: throw ce("Could not resolve host name - Out of memory.");
            case EAI_NONAME: throw ce("Could not resolve host name - Host not found.");
            default:         throw ce("Could not resolve host name - Unknown error.");
            }
         }
         // now create the socket by trying to connect to all possible addresses
         for(auto ptr = result; ptr; ptr = ptr->ai_next)
         {
            sock_ = socket(ptr->ai_family, ptr->ai_socktype, ptr->ai_protocol);
            if(sock_ == -1)
            {
               continue;
            }
            const auto res = ::connect(sock_, ptr->ai_addr, static_cast<int>(ptr->ai_addrlen));
            if(res == -1)
            {
               close(sock_);
               sock_ = -1;
            }
         }
      }
      // if sock_ is invalid some sort of error occured
      if(sock_ == -1)
      {
         throw Communication_error("Could not connect to server.");
      }
   }